

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O3

MeshGL * CubeUV(void)

{
  iterator __position;
  MeshGL *in_RDI;
  uint local_138 [36];
  undefined1 local_a8 [136];
  undefined1 local_20 [8];
  
  memset(&in_RDI->vertProperties,0,0xdc);
  in_RDI->numProp = 5;
  memcpy(local_138,&DAT_0019d300,0x118);
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&in_RDI->vertProperties,local_138,local_20);
  memcpy(local_138,&DAT_0019d418,0x90);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&in_RDI->triVerts,local_138,
             local_a8);
  local_138[0] = 8;
  local_138[1] = 0xc;
  local_138[2] = 0xd;
  local_138[3] = 9;
  local_138[4] = 10;
  local_138[5] = 0xb;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&in_RDI->mergeFromVert,local_138);
  local_138[0] = 4;
  local_138[1] = 4;
  local_138[2] = 5;
  local_138[3] = 6;
  local_138[4] = 6;
  local_138[5] = 7;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&in_RDI->mergeToVert,local_138);
  local_138[0] = manifold::Manifold::ReserveIDs(1);
  __position._M_current =
       (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&in_RDI->runOriginalID,__position,local_138);
  }
  else {
    *__position._M_current = local_138[0];
    (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return in_RDI;
}

Assistant:

MeshGL CubeUV() {
  MeshGL mgl;
  mgl.numProp = 5;
  mgl.vertProperties = {0.5,  -0.5, 0.5,  0.5,  0.66,  //
                        -0.5, -0.5, 0.5,  0.25, 0.66,  //
                        0.5,  0.5,  0.5,  0.5,  0.33,  //
                        -0.5, 0.5,  0.5,  0.25, 0.33,  //
                        -0.5, -0.5, -0.5, 1.0,  0.66,  //
                        0.5,  -0.5, -0.5, 0.75, 0.66,  //
                        -0.5, 0.5,  -0.5, 1.0,  0.33,  //
                        0.5,  0.5,  -0.5, 0.75, 0.33,  //
                        -0.5, -0.5, -0.5, 0.0,  0.66,  //
                        -0.5, 0.5,  -0.5, 0.0,  0.33,  //
                        -0.5, 0.5,  -0.5, 0.25, 0.0,   //
                        0.5,  0.5,  -0.5, 0.5,  0.0,   //
                        -0.5, -0.5, -0.5, 0.25, 1.0,   //
                        0.5,  -0.5, -0.5, 0.5,  1.0};
  mgl.triVerts = {3, 1, 0, 3, 0, 2, 7,  5,  4, 7,  4, 6, 2, 0, 5,  2, 5,  7,
                  9, 8, 1, 9, 1, 3, 11, 10, 3, 11, 3, 2, 0, 1, 12, 0, 12, 13};
  mgl.mergeFromVert = {8, 12, 13, 9, 10, 11};
  mgl.mergeToVert = {4, 4, 5, 6, 6, 7};
  mgl.runOriginalID.push_back(Manifold::ReserveIDs(1));
  return mgl;
}